

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_ServerRejectsMissingTransportParams_Test::TestBody
          (QUICMethodTest_ServerRejectsMissingTransportParams_Test *this)

{
  bool bVar1;
  pointer psVar2;
  char *pcVar3;
  pointer ssl;
  char *in_R9;
  string local_1b8;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_150;
  Message local_148;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c0;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  string local_90;
  AssertHelper local_70 [3];
  Message local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  SSL_QUIC_METHOD quic_method;
  QUICMethodTest_ServerRejectsMissingTransportParams_Test *this_local;
  
  QUICMethodTest::DefaultQUICMethod
            ((SSL_QUIC_METHOD *)&gtest_ar_.message_,&this->super_QUICMethodTest);
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).client_ctx_);
  local_4c = SSL_CTX_set_quic_method(psVar2,(SSL_QUIC_METHOD *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_48,&local_4c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_48,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1fba,pcVar3);
    testing::internal::AssertHelper::operator=(local_70,&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(&local_58);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_QUICMethodTest).server_ctx_);
    local_ac = SSL_CTX_set_quic_method(psVar2,(SSL_QUIC_METHOD *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_a8,&local_ac,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_a8,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1fbb,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_b8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_f1 = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_f0,&local_f1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_f0,
                   (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1fbd,pcVar3);
        testing::internal::AssertHelper::operator=(&local_108,&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_100);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        ssl = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                        (&(this->super_QUICMethodTest).client_);
        local_13c = SSL_set_quic_transport_params(ssl,(uint8_t *)0x0,0);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_138,&local_13c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar1) {
          testing::Message::Message(&local_148);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_138,
                     (AssertionResult *)"SSL_set_quic_transport_params(client_.get(), nullptr, 0)",
                     "false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1fbe,pcVar3);
          testing::internal::AssertHelper::operator=(&local_150,&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_148);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_181 = QUICMethodTest::RunQUICHandshakesAndExpectError
                                (&this->super_QUICMethodTest,kClientError);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_180,&local_181,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
          if (!bVar1) {
            testing::Message::Message(&local_190);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_1b8,(internal *)local_180,
                       (AssertionResult *)
                       "RunQUICHandshakesAndExpectError(ExpectedError::kClientError)","false","true"
                       ,in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_198,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1fbf,pcVar3);
            testing::internal::AssertHelper::operator=(&local_198,&local_190);
            testing::internal::AssertHelper::~AssertHelper(&local_198);
            std::__cxx11::string::~string((string *)&local_1b8);
            testing::Message::~Message(&local_190);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(QUICMethodTest, ServerRejectsMissingTransportParams) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  ASSERT_TRUE(CreateClientAndServer());
  ASSERT_TRUE(SSL_set_quic_transport_params(client_.get(), nullptr, 0));
  ASSERT_TRUE(RunQUICHandshakesAndExpectError(ExpectedError::kClientError));
}